

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O0

string * Vault::operator+(string *__return_storage_ptr__,
                         Tiny<Vault::HostDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *tiny,char *string)

{
  string local_40;
  char *local_20;
  char *string_local;
  Tiny<Vault::HostDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *tiny_local;
  
  local_20 = string;
  string_local = (char *)tiny;
  tiny_local = (Tiny<Vault::HostDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__return_storage_ptr__;
  Tiny<Vault::HostDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::toString(&local_40,tiny);
  std::operator+(__return_storage_ptr__,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string operator+(const Tiny &tiny, const char *string) {
    return tiny.toString() + string;
  }